

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_redraw_all(void)

{
  term *t;
  long lVar1;
  
  t = Term;
  lVar1 = 0;
  do {
    if (*(term **)((long)angband_term + lVar1) != (term *)0x0) {
      Term_activate(*(term **)((long)angband_term + lVar1));
      Term->total_erase = true;
      Term_fresh();
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x40);
  Term_activate(t);
  return 0;
}

Assistant:

extern errr Term_redraw_all(void)
{
	term *old = Term;
	errr combined = 0;
	int j;

	for (j = 0; j < ANGBAND_TERM_MAX; j++) {
		errr one_result;

		if (!angband_term[j]) continue;
		(void) Term_activate(angband_term[j]);
		one_result = Term_redraw();
		if (!one_result) {
			combined = one_result;
		}
	}
	(void) Term_activate(old);

	return combined;
}